

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  int row_1;
  long lVar4;
  int row;
  long lVar5;
  Vector<float,_3> *pVVar6;
  int col;
  long lVar7;
  float v;
  float fVar8;
  undefined4 uVar9;
  Vector<float,_3> res;
  undefined8 local_4c;
  float local_44;
  int local_40 [6];
  Mat3 m;
  
  pfVar2 = (float *)&m;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar7) = uVar9;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar5 != 3);
  pVVar3 = (Vector<float,_3> *)&m;
  m.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  m.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  m.m_data.m_data[1].m_data[0] = (float)uVar1;
  m.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  m.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  m.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  m.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  local_4c = *(undefined8 *)(evalCtx->coords).m_data;
  local_44 = (evalCtx->coords).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar4 = 0;
  do {
    fVar8 = 0.0;
    lVar5 = 0;
    pVVar6 = pVVar3;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] *
                      *(float *)((long)&local_4c + lVar5 * 4);
      lVar5 = lVar5 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar5 != 3);
    res.m_data[lVar4] = fVar8;
    lVar4 = lVar4 + 1;
    pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
  } while (lVar4 != 3);
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar4]] = res.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}